

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall
QTreeViewPrivate::adjustViewOptionsForIndex
          (QTreeViewPrivate *this,QStyleOptionViewItem *option,QModelIndex *current)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QList<QStyleOptionViewItem::ViewItemPosition> local_68;
  QList<int> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = viewIndex(this,current);
  uVar4 = *(uint *)&(this->viewItems).d.ptr[iVar3].field_0x1c;
  uVar7 = uVar4 << 0x12;
  (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       uVar7 & 0x200000 | (uVar4 & 4) << 0x11 |
       uVar7 & 0x40000 |
       (option->super_QStyleOption).state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
       super_QFlagsStorage<QStyle::StateFlag>.i;
  bVar5 = true;
  if (((this->super_QAbstractItemViewPrivate).selectionBehavior & SelectRows) == SelectItems) {
    bVar5 = option->showDecorationSelected;
  }
  option->showDecorationSelected = bVar5;
  local_48.d.d = (Data *)0x0;
  local_48.d.ptr = (int *)0x0;
  uVar6 = 0;
  local_48.d.size = 0;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (ViewItemPosition *)0x0;
  local_68.d.size = 0;
  uVar8 = *(ulong *)&(this->viewItems).d.ptr[iVar3].field_0x1c;
  if ((uVar8 & 2) != 0) {
    uVar4 = QHeaderView::visualIndex(this->header,0);
    uVar6 = (ulong)uVar4;
  }
  if ((uVar8 & 2) == 0) {
    iVar3 = QHeaderView::count(this->header);
    iVar3 = iVar3 + -1;
  }
  else {
    iVar3 = QHeaderView::visualIndex(this->header,0);
  }
  calcLogicalIndices(this,&local_48,&local_68,(int)uVar6,iVar3);
  if (local_48.d.size != 0) {
    uVar8 = 0xfffffffffffffffc;
    do {
      iVar3 = (int)uVar6;
      lVar1 = local_48.d.size * -4 + uVar8;
      if (lVar1 == -4) goto LAB_005ad014;
      uVar6 = uVar8 + 4;
      lVar2 = uVar8 + 4;
      uVar8 = uVar6;
    } while (*(int *)((long)local_48.d.ptr + lVar2) != current->c);
    iVar3 = (int)((long)uVar6 >> 2);
LAB_005ad014:
    if (lVar1 != -4) goto LAB_005ad021;
  }
  iVar3 = -1;
LAB_005ad021:
  option->viewItemPosition = local_68.d.ptr[iVar3];
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTreeViewPrivate::adjustViewOptionsForIndex(QStyleOptionViewItem *option, const QModelIndex &current) const
{
    const int row = viewIndex(current); // get the index in viewItems[]
    option->state = option->state | (viewItems.at(row).expanded ? QStyle::State_Open : QStyle::State_None)
                                  | (viewItems.at(row).hasChildren ? QStyle::State_Children : QStyle::State_None)
                                  | (viewItems.at(row).hasMoreSiblings ? QStyle::State_Sibling : QStyle::State_None);

    option->showDecorationSelected = (selectionBehavior & QTreeView::SelectRows)
                                     || option->showDecorationSelected;

    QList<int>
            logicalIndices; // index = visual index of visible columns only. data = logical index.
    QList<QStyleOptionViewItem::ViewItemPosition>
            viewItemPosList; // vector of left/middle/end for each logicalIndex, visible columns
                             // only.
    const bool spanning = viewItems.at(row).spanning;
    const int left = (spanning ? header->visualIndex(0) : 0);
    const int right = (spanning ? header->visualIndex(0) : header->count() - 1 );
    calcLogicalIndices(&logicalIndices, &viewItemPosList, left, right);

    const int visualIndex = logicalIndices.indexOf(current.column());
    option->viewItemPosition = viewItemPosList.at(visualIndex);
}